

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

void __thiscall SQArray::SQArray(SQArray *this,SQSharedState *ss,SQInteger nsize)

{
  SQObjectPtr *in_RDX;
  SQSharedState *in_RSI;
  SQCollectable_conflict *in_RDI;
  SQCollectable *in_stack_ffffffffffffffb0;
  SQCollectable_conflict *this_00;
  SQObjectPtr local_38 [2];
  SQObjectPtr *local_18;
  SQSharedState *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  SQCollectable::SQCollectable(in_stack_ffffffffffffffb0);
  (in_RDI->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQArray_00164608;
  this_00 = in_RDI + 1;
  sqvector<SQObjectPtr>::sqvector((sqvector<SQObjectPtr> *)this_00);
  ::SQObjectPtr::SQObjectPtr(local_38);
  sqvector<SQObjectPtr>::resize((sqvector<SQObjectPtr> *)this_00,(SQUnsignedInteger)in_RDI,local_18)
  ;
  ::SQObjectPtr::~SQObjectPtr(local_18);
  in_RDI->_next = (SQCollectable_conflict *)0x0;
  in_RDI->_prev = (SQCollectable_conflict *)0x0;
  in_RDI->_sharedstate = local_10;
  SQCollectable::AddToChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
  return;
}

Assistant:

SQArray(SQSharedState *ss,SQInteger nsize){_values.resize(nsize); INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this);}